

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber-unix.cpp
# Opt level: O0

void __thiscall
cilk_fiber_sysdep::jump_to_resume_other_sysdep(cilk_fiber_sysdep *this,cilk_fiber_sysdep *other)

{
  bool bVar1;
  cilk_fiber_sysdep *in_RDI;
  
  bVar1 = cilk_fiber::is_resumable(&in_RDI->super_cilk_fiber);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    resume_other_sysdep(in_RDI,(cilk_fiber_sysdep *)0x11857c);
    __cilkrts_bug("Should not get here");
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/cilk_fiber-unix.cpp"
                ,0xa9,"!this->is_resumable()");
}

Assistant:

NORETURN cilk_fiber_sysdep::jump_to_resume_other_sysdep(cilk_fiber_sysdep* other)
{
#if SUPPORT_GET_CURRENT_FIBER
    cilkos_set_tls_cilk_fiber(other);
#endif
    CILK_ASSERT(!this->is_resumable());

    // Jump to the other fiber.  But we are never coming back because
    // this fiber is being reset.
    resume_other_sysdep(other);

    // We should never come back here...
    __cilkrts_bug("Should not get here");
}